

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O0

ON_Interval __thiscall ON_PolylineCurve::Domain(ON_PolylineCurve *this)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  int count;
  ON_PolylineCurve *this_local;
  ON_Interval d;
  
  ON_Interval::ON_Interval((ON_Interval *)&this_local);
  iVar2 = PointCount(this);
  if (1 < iVar2) {
    pdVar3 = ON_SimpleArray<double>::operator[](&this->m_t,0);
    dVar1 = *pdVar3;
    pdVar3 = ON_SimpleArray<double>::operator[](&this->m_t,iVar2 + -1);
    if (dVar1 < *pdVar3) {
      pdVar3 = ON_SimpleArray<double>::operator[](&this->m_t,0);
      dVar1 = *pdVar3;
      pdVar3 = ON_SimpleArray<double>::operator[](&this->m_t,iVar2 + -1);
      ON_Interval::Set((ON_Interval *)&this_local,dVar1,*pdVar3);
    }
  }
  return (ON_Interval)_this_local;
}

Assistant:

ON_Interval ON_PolylineCurve::Domain() const
{
  ON_Interval d;
  //bool rc = false;
  const int count = PointCount();
  if ( count >= 2 && m_t[0] < m_t[count-1] ) {
    d.Set(m_t[0],m_t[count-1]);
  }
  return d;
}